

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinfl_decompress_mem_to_callback
              (void *pIn_buf,size_t *pIn_buf_size,tinfl_put_buf_func_ptr pPut_buf_func,
              void *pPut_buf_user,int flags)

{
  tinfl_status tVar1;
  int iVar2;
  mz_uint8 *pOut_buf_start;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  int iVar6;
  size_t dst_buf_size;
  size_t in_buf_size;
  tinfl_decompressor decomp;
  size_t local_2b50;
  size_t local_2b48;
  tinfl_put_buf_func_ptr local_2b40;
  void *local_2b38;
  void *local_2b30;
  tinfl_decompressor local_2b28;
  
  local_2b40 = pPut_buf_func;
  local_2b38 = pPut_buf_user;
  local_2b30 = pIn_buf;
  pOut_buf_start = (mz_uint8 *)malloc(0x8000);
  if (pOut_buf_start == (mz_uint8 *)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    local_2b28.m_state = 0;
    sVar5 = 0;
    uVar4 = 0;
    while( true ) {
      local_2b48 = *pIn_buf_size - sVar5;
      local_2b50 = 0x8000 - uVar4;
      tVar1 = tinfl_decompress(&local_2b28,(mz_uint8 *)((long)local_2b30 + sVar5),&local_2b48,
                               pOut_buf_start,pOut_buf_start + uVar4,&local_2b50,flags & 0xfffffff9)
      ;
      sVar5 = sVar5 + local_2b48;
      iVar6 = (int)local_2b50;
      if (local_2b50 != 0) {
        iVar2 = (*local_2b40)(pOut_buf_start + uVar4,iVar6,local_2b38);
        if (iVar2 == 0) {
          uVar3 = 0;
          goto LAB_00166ea7;
        }
      }
      if (tVar1 != TINFL_STATUS_HAS_MORE_OUTPUT) break;
      uVar4 = (ulong)(iVar6 + (int)uVar4 & 0x7fff);
    }
    uVar3 = (uint)(tVar1 == TINFL_STATUS_DONE);
LAB_00166ea7:
    free(pOut_buf_start);
    *pIn_buf_size = sVar5;
  }
  return uVar3;
}

Assistant:

int tinfl_decompress_mem_to_callback(const void *pIn_buf, size_t *pIn_buf_size,
                                     tinfl_put_buf_func_ptr pPut_buf_func,
                                     void *pPut_buf_user, int flags) {
  int result = 0;
  tinfl_decompressor decomp;
  mz_uint8 *pDict = (mz_uint8 *)MZ_MALLOC(TINFL_LZ_DICT_SIZE);
  size_t in_buf_ofs = 0, dict_ofs = 0;
  if (!pDict) return TINFL_STATUS_FAILED;
  tinfl_init(&decomp);
  for (;;) {
    size_t in_buf_size = *pIn_buf_size - in_buf_ofs,
           dst_buf_size = TINFL_LZ_DICT_SIZE - dict_ofs;
    tinfl_status status =
        tinfl_decompress(&decomp, (const mz_uint8 *)pIn_buf + in_buf_ofs,
                         &in_buf_size, pDict, pDict + dict_ofs, &dst_buf_size,
                         (flags & ~(TINFL_FLAG_HAS_MORE_INPUT |
                                    TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)));
    in_buf_ofs += in_buf_size;
    if ((dst_buf_size) &&
        (!(*pPut_buf_func)(pDict + dict_ofs, (int)dst_buf_size, pPut_buf_user)))
      break;
    if (status != TINFL_STATUS_HAS_MORE_OUTPUT) {
      result = (status == TINFL_STATUS_DONE);
      break;
    }
    dict_ofs = (dict_ofs + dst_buf_size) & (TINFL_LZ_DICT_SIZE - 1);
  }
  MZ_FREE(pDict);
  *pIn_buf_size = in_buf_ofs;
  return result;
}